

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

char16_t * __thiscall QUtf8::convertToUnicode(QUtf8 *this,char16_t *dst,QByteArrayView in)

{
  QUtf8 *pQVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint c;
  byte *pbVar24;
  byte *pbVar25;
  byte *pbVar26;
  QUtf8 *pQVar27;
  byte *pbVar28;
  long lVar29;
  uint c_1;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pbVar24 = (byte *)in.m_size;
  if (2 < (long)dst) {
    if (pbVar24[2] != 0xbf || *(short *)pbVar24 != -0x4411) goto LAB_00124a40;
    pbVar24 = pbVar24 + 3;
    dst = (char16_t *)((long)dst + -3);
  }
  if ((long)dst < 1) {
    return (char16_t *)this;
  }
LAB_00124a40:
  pbVar28 = (byte *)((long)dst + (long)pbVar24);
LAB_00124a57:
  lVar29 = (long)pbVar28 - (long)pbVar24;
  pbVar25 = pbVar28;
  if (0xf < lVar29) {
    pbVar25 = pbVar24 + -0x10;
    lVar30 = 0x10;
    pQVar27 = this + -0x20;
LAB_00124a74:
    if (lVar30 < lVar29) goto code_r0x00124a79;
    auVar2 = *(undefined1 (*) [16])(pbVar28 + -0x10);
    uVar5 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar2._0_13_;
    auVar7[0xe] = auVar2[7];
    auVar9[0xc] = auVar2[6];
    auVar9._0_12_ = auVar2._0_12_;
    auVar9._13_2_ = auVar7._13_2_;
    auVar11[0xb] = 0;
    auVar11._0_11_ = auVar2._0_11_;
    auVar11._12_3_ = auVar9._12_3_;
    auVar13[10] = auVar2[5];
    auVar13._0_10_ = auVar2._0_10_;
    auVar13._11_4_ = auVar11._11_4_;
    auVar15[9] = 0;
    auVar15._0_9_ = auVar2._0_9_;
    auVar15._10_5_ = auVar13._10_5_;
    auVar17[8] = auVar2[4];
    auVar17._0_8_ = auVar2._0_8_;
    auVar17._9_6_ = auVar15._9_6_;
    auVar19._7_8_ = 0;
    auVar19._0_7_ = auVar17._8_7_;
    auVar22._1_8_ = SUB158(auVar19 << 0x40,7);
    auVar22[0] = auVar2[3];
    auVar22._9_6_ = 0;
    auVar23._1_10_ = SUB1510(auVar22 << 0x30,5);
    auVar23[0] = auVar2[2];
    auVar23._11_4_ = 0;
    auVar34._3_12_ = SUB1512(auVar23 << 0x20,3);
    auVar34[2] = auVar2[1];
    auVar34[0] = auVar2[0];
    auVar34[1] = 0;
    auVar34[0xf] = 0;
    *(undefined1 (*) [16])(this + lVar29 * 2 + -0x20) = auVar34;
    auVar32[1] = 0;
    auVar32[0] = auVar2[8];
    auVar32[2] = auVar2[9];
    auVar32[3] = 0;
    auVar32[4] = auVar2[10];
    auVar32[5] = 0;
    auVar32[6] = auVar2[0xb];
    auVar32[7] = 0;
    auVar32[8] = auVar2[0xc];
    auVar32[9] = 0;
    auVar32[10] = auVar2[0xd];
    auVar32[0xb] = 0;
    auVar32[0xc] = auVar2[0xe];
    auVar32[0xd] = 0;
    auVar32[0xe] = auVar2[0xf];
    auVar32[0xf] = 0;
    *(undefined1 (*) [16])(this + lVar29 * 2 + -0x10) = auVar32;
    if (uVar5 == 0) {
      return (char16_t *)(this + lVar29 * 2);
    }
    uVar3 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    pbVar24 = *(undefined1 (*) [16])(pbVar28 + -0x10) + uVar3;
    this = this + (ulong)uVar3 * 2 + lVar29 * 2 + -0x20;
    if (pbVar24 == pbVar28) {
      return (char16_t *)this;
    }
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    pbVar25 = pbVar28 + ((ulong)uVar3 - 0xf);
  }
  goto LAB_00124b3c;
code_r0x00124a79:
  pQVar1 = pQVar27 + 0x20;
  auVar2 = *(undefined1 (*) [16])(pbVar25 + 0x10);
  pbVar25 = pbVar25 + 0x10;
  uVar5 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar2._0_13_;
  auVar6[0xe] = auVar2[7];
  auVar8[0xc] = auVar2[6];
  auVar8._0_12_ = auVar2._0_12_;
  auVar8._13_2_ = auVar6._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar2._0_11_;
  auVar10._12_3_ = auVar8._12_3_;
  auVar12[10] = auVar2[5];
  auVar12._0_10_ = auVar2._0_10_;
  auVar12._11_4_ = auVar10._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar2._0_9_;
  auVar14._10_5_ = auVar12._10_5_;
  auVar16[8] = auVar2[4];
  auVar16._0_8_ = auVar2._0_8_;
  auVar16._9_6_ = auVar14._9_6_;
  auVar18._7_8_ = 0;
  auVar18._0_7_ = auVar16._8_7_;
  auVar20._1_8_ = SUB158(auVar18 << 0x40,7);
  auVar20[0] = auVar2[3];
  auVar20._9_6_ = 0;
  auVar21._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar21[0] = auVar2[2];
  auVar21._11_4_ = 0;
  auVar33._3_12_ = SUB1512(auVar21 << 0x20,3);
  auVar33[2] = auVar2[1];
  auVar33[0] = auVar2[0];
  auVar33[1] = 0;
  auVar33[0xf] = 0;
  *(undefined1 (*) [16])(pQVar27 + 0x20) = auVar33;
  auVar31[1] = 0;
  auVar31[0] = auVar2[8];
  auVar31[2] = auVar2[9];
  auVar31[3] = 0;
  auVar31[4] = auVar2[10];
  auVar31[5] = 0;
  auVar31[6] = auVar2[0xb];
  auVar31[7] = 0;
  auVar31[8] = auVar2[0xc];
  auVar31[9] = 0;
  auVar31[10] = auVar2[0xd];
  auVar31[0xb] = 0;
  auVar31[0xc] = auVar2[0xe];
  auVar31[0xd] = 0;
  auVar31[0xe] = auVar2[0xf];
  auVar31[0xf] = 0;
  *(undefined1 (*) [16])(pQVar27 + 0x30) = auVar31;
  lVar30 = lVar30 + 0x10;
  pQVar27 = pQVar1;
  if (uVar5 != 0) goto code_r0x00124aac;
  goto LAB_00124a74;
code_r0x00124aac:
  uVar3 = 0;
  if (uVar5 != 0) {
    for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  if (pbVar25 + uVar3 == pbVar28) {
    return (char16_t *)(pQVar1 + (ulong)uVar3 * 2);
  }
  uVar4 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  this = pQVar1 + (ulong)uVar3 * 2;
  pbVar24 = pbVar25 + uVar3;
  pbVar25 = pbVar25 + (ulong)uVar4 + 1;
LAB_00124b3c:
  do {
    pbVar26 = pbVar24 + 1;
    if ((char)*pbVar24 < '\0') {
      *(char16_t *)this = L'�';
    }
    else {
      *(ushort *)this = (ushort)*pbVar24;
    }
    this = this + 2;
    pbVar24 = pbVar26;
  } while (pbVar26 < pbVar25);
  if (pbVar28 <= pbVar26) {
    return (char16_t *)this;
  }
  goto LAB_00124a57;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in) noexcept
{
    // check if have to skip a BOM
    auto bom = QByteArrayView::fromArray(utf8bom);
    if (in.size() >= bom.size() && in.first(bom.size()) == bom)
        in.slice(sizeof(utf8bom));

    return convertToUnicode(dst, in, [](char16_t *&dst, ...) {
        // decoding error
        *dst++ = QChar::ReplacementCharacter;
        return true;        // continue decoding
    });
}